

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.h
# Opt level: O0

void __thiscall Assimp::Q3Shader::ShaderDataBlock::~ShaderDataBlock(ShaderDataBlock *this)

{
  ShaderDataBlock *this_local;
  
  std::__cxx11::
  list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>::~list
            (&this->maps);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

ShaderDataBlock() AI_NO_EXCEPT
        :   cull    (CULL_CW)
    {}